

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::SetAllOrders(SFFile *this,int order)

{
  uint uVar1;
  SFPerc *pSVar2;
  uint local_1c;
  int local_18;
  uint i_1;
  int i;
  int order_local;
  SFFile *this_local;
  
  for (local_18 = 0; local_18 < this->NumPresets; local_18 = local_18 + 1) {
    this->Presets[local_18].field_0x15 =
         this->Presets[local_18].field_0x15 & 0x80 | (byte)order & 0x7f;
  }
  local_1c = 0;
  while( true ) {
    uVar1 = TArray<SFPerc,_SFPerc>::Size(&this->Percussion);
    if (uVar1 <= local_1c) break;
    pSVar2 = TArray<SFPerc,_SFPerc>::operator[](&this->Percussion,(ulong)local_1c);
    pSVar2->LoadOrder = (byte)order;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void SFFile::SetAllOrders(int order)
{
	for (int i = 0; i < NumPresets; ++i)
	{
		Presets[i].LoadOrder = order;
	}
	for (unsigned int i = 0; i < Percussion.Size(); ++i)
	{
		Percussion[i].LoadOrder = order;
	}
}